

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

Error __thiscall llvm::sys::fs::TempFile::discard(TempFile *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  size_t extraout_RDX;
  undefined1 *in_RSI;
  StringRef Filename;
  error_code EC;
  Twine local_40;
  
  *in_RSI = 1;
  std::_V2::system_category();
  if (*(long *)(in_RSI + 0x10) == 0) {
    iVar1 = 0;
  }
  else {
    Twine::Twine(&local_40,(string *)(in_RSI + 8));
    iVar1 = remove((fs *)&local_40,(char *)0x1);
    Filename.Length = extraout_RDX;
    Filename.Data = *(char **)(in_RSI + 0x10);
    DontRemoveFileOnSignal(*(sys **)(in_RSI + 8),Filename);
  }
  if (iVar1 == 0) {
    std::__cxx11::string::_M_replace((ulong)(in_RSI + 8),0,*(char **)(in_RSI + 0x10),0x1b0f5f);
  }
  if (*(int *)(in_RSI + 0x28) != -1) {
    iVar2 = close(*(int *)(in_RSI + 0x28));
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      std::_V2::generic_category();
      goto LAB_0015e3c8;
    }
  }
  *(undefined4 *)(in_RSI + 0x28) = 0xffffffff;
LAB_0015e3c8:
  EC._M_cat._0_4_ = iVar1;
  EC._0_8_ = this;
  EC._M_cat._4_4_ = 0;
  errorCodeToError(EC);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error TempFile::discard() {
  Done = true;
  std::error_code RemoveEC;
// On windows closing will remove the file.
#ifndef _WIN32
  // Always try to close and remove.
  if (!TmpName.empty()) {
    RemoveEC = fs::remove(TmpName);
    sys::DontRemoveFileOnSignal(TmpName);
  }
#endif

  if (!RemoveEC)
    TmpName = "";

  if (FD != -1 && close(FD) == -1) {
    std::error_code EC = std::error_code(errno, std::generic_category());
    return errorCodeToError(EC);
  }
  FD = -1;

  return errorCodeToError(RemoveEC);
}